

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  char *extraout_RAX;
  uint size;
  char *pcVar2;
  pair<const_char_*,_int> pVar3;
  anon_class_8_1_a7a63227 local_40;
  anon_class_8_1_a7a63227 local_30;
  
  if (arena == (Arena *)0x0) {
    ReadArenaString((EpsCopyInputStream *)&stack0xffffffffffffffc0);
  }
  else {
    bVar1 = *ptr;
    size = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar3 = ReadSizeFallback(ptr,(uint)bVar1);
      pcVar2 = pVar3.first;
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      size = pVar3.second;
    }
    else {
      pcVar2 = ptr + 1;
    }
    local_40.arena = arena;
    local_30.arena = arena;
    s_00 = absl::lts_20240722::utility_internal::
           IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                     (&stack0xffffffffffffffc0,&stack0xffffffffffffffd0);
    if (s_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      if (((ulong)s_00 & 3) == 0) {
        (s->tagged_ptr_).ptr_ = (void *)((ulong)s_00 | 3);
        pcVar2 = ReadString(this,pcVar2,size,s_00);
        return pcVar2;
      }
      goto LAB_001375da;
    }
  }
  ReadArenaString((EpsCopyInputStream *)&stack0xffffffffffffffc0);
LAB_001375da:
  ReadArenaString();
  absl::lts_20240722::Mutex::Dtor();
  return extraout_RAX;
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  ScopedCheckPtrInvariants check(&s->tagged_ptr_);
  ABSL_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = s->NewString(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ptr;
}